

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf2yaml.cpp
# Opt level: O2

void dumpDebugARanges(DWARFContext *DCtx,Data *Y)

{
  DataExtractor data;
  pointer pDVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t extraout_RDX;
  pointer pDVar4;
  undefined1 local_e0 [8];
  ARange Range;
  undefined1 local_98 [8];
  DWARFDebugArangeSet Set;
  uint64_t Offset;
  undefined6 uStack_4e;
  
  iVar3 = (*((DCtx->DObj)._M_t.
             super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
             .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
            _vptr_DWARFObject[0xc])();
  data.Data.Data._4_4_ = extraout_var;
  data.Data.Data._0_4_ = iVar3;
  iVar3 = (*((DCtx->DObj)._M_t.
             super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
             .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
            _vptr_DWARFObject[5])();
  Set.ArangeDescriptors.
  super__Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  llvm::DWARFDebugArangeSet::DWARFDebugArangeSet((DWARFDebugArangeSet *)local_98);
  while( true ) {
    data.AddressSize = '\0';
    data.IsLittleEndian = (byte)iVar3;
    data._18_6_ = uStack_4e;
    data.Data.Length = extraout_RDX;
    bVar2 = llvm::DWARFDebugArangeSet::extract
                      ((DWARFDebugArangeSet *)local_98,data,
                       (uint64_t *)
                       &Set.ArangeDescriptors.
                        super__Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pDVar1 = Set.ArangeDescriptors.
             super__Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (!bVar2) break;
    Range.Descriptors.
    super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    Range.AddrSize = '\0';
    Range.SegSize = '\0';
    Range._26_6_ = 0;
    Range.Descriptors.
    super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if ((uint32_t)Set.Offset == 0xffffffff) {
      Range.Length.TotalLength = 0xffffffff;
      Range.Length._4_4_ = 0;
    }
    local_e0._0_4_ = (uint32_t)Set.Offset;
    Range.Length.TotalLength64._0_2_ = (undefined2)Set.HeaderData.Length;
    Range.Length.TotalLength64._4_4_ = Set.Offset._4_4_;
    Range.Version = Set.HeaderData.Length._2_2_;
    for (pDVar4 = (pointer)Set._16_8_; pDVar4 != pDVar1; pDVar4 = pDVar4 + 1) {
      Range.Descriptors.
      super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pDVar4->Address;
      std::
      vector<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
      ::push_back((vector<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
                   *)&Range.AddrSize,
                  (value_type *)
                  &Range.Descriptors.
                   super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>::push_back
              (&Y->ARanges,(value_type *)local_e0);
    std::
    _Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
    ::~_Vector_base((_Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
                     *)&Range.AddrSize);
  }
  std::
  _Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
  ::~_Vector_base((_Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
                   *)&Set.HeaderData.Version);
  return;
}

Assistant:

void dumpDebugARanges(DWARFContext &DCtx, DWARFYAML::Data &Y) {
  DataExtractor ArangesData(DCtx.getDWARFObj().getArangesSection(),
                            DCtx.isLittleEndian(), 0);
  uint64_t Offset = 0;
  DWARFDebugArangeSet Set;

  while (Set.extract(ArangesData, &Offset)) {
    DWARFYAML::ARange Range;
    Range.Length.setLength(Set.getHeader().Length);
    Range.Version = Set.getHeader().Version;
    Range.CuOffset = Set.getHeader().CuOffset;
    Range.AddrSize = Set.getHeader().AddrSize;
    Range.SegSize = Set.getHeader().SegSize;
    for (auto Descriptor : Set.descriptors()) {
      DWARFYAML::ARangeDescriptor Desc;
      Desc.Address = Descriptor.Address;
      Desc.Length = Descriptor.Length;
      Range.Descriptors.push_back(Desc);
    }
    Y.ARanges.push_back(Range);
  }
}